

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_bit.cpp
# Opt level: O0

ssize_t cornelich::util::stop_bit::write(int __fd,void *__buf,size_t __n)

{
  int iVar1;
  byte bVar2;
  undefined4 in_register_0000003c;
  long lVar3;
  uint64_t n2;
  size_t sStack_20;
  bool neg;
  int64_t value_local;
  int32_t *offset_local;
  uint8_t *buffer_local;
  
  lVar3 = CONCAT44(in_register_0000003c,__fd);
  if ((__n & 0xffffffffffffff80) == 0) {
    iVar1 = *__buf;
    *(int *)__buf = iVar1 + 1;
    *(byte *)(lVar3 + iVar1) = (byte)__n & 0x7f;
  }
  else if ((__n & 0xffffffffffffc000) == 0) {
    iVar1 = *__buf;
    *(int *)__buf = iVar1 + 1;
    *(byte *)(lVar3 + iVar1) = (byte)__n & 0x7f | 0x80;
    iVar1 = *__buf;
    *(int *)__buf = iVar1 + 1;
    *(char *)(lVar3 + iVar1) = (char)((long)__n >> 7);
  }
  else {
    sStack_20 = __n;
    if ((long)__n < 0) {
      sStack_20 = __n ^ 0xffffffffffffffff;
    }
    while( true ) {
      bVar2 = (byte)sStack_20;
      if ((long)sStack_20 >> 7 == 0) break;
      iVar1 = *__buf;
      *(int *)__buf = iVar1 + 1;
      *(byte *)(lVar3 + iVar1) = bVar2 | 0x80;
      sStack_20 = (long)sStack_20 >> 7;
    }
    if ((long)__n < 0) {
      iVar1 = *__buf;
      *(int *)__buf = iVar1 + 1;
      *(byte *)(lVar3 + iVar1) = bVar2 | 0x80;
      iVar1 = *__buf;
      *(int *)__buf = iVar1 + 1;
      *(undefined1 *)(lVar3 + iVar1) = 0;
    }
    else {
      iVar1 = *__buf;
      *(int *)__buf = iVar1 + 1;
      *(byte *)(lVar3 + iVar1) = bVar2;
    }
  }
  return lVar3;
}

Assistant:

void write(std::uint8_t * buffer, std::int32_t & offset, std::int64_t value)
{
    if((value & ~0x7F) == 0)
    {
        buffer[offset++] = value & 0x7f;
        return;
    }
    if((value & ~0x3FFF) == 0)
    {
        buffer[offset++] = static_cast<std::uint8_t>(value & 0x7f) | 0x80;
        buffer[offset++] = static_cast<std::uint8_t>(value >> 7);
        return;
    }
    auto neg = false;
    if(value < 0)
    {
        neg = true;
        value = ~value;
    }
    std::uint64_t n2;
    while ((n2 = static_cast<std::uint64_t>(value >> 7)) != 0)
    {
        buffer[offset++] = static_cast<std::uint8_t>(0x80L | value);
        value = static_cast<std::int64_t>(n2);
    }
    // final byte
    if (!neg)
        buffer[offset++] = static_cast<std::uint8_t>(value);
    else
    {
        buffer[offset++] = static_cast<std::uint8_t>(0x80 | value);
        buffer[offset++] = 0;
    }
}